

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

string * __thiscall
Lexer::typeToString_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,Type type)

{
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;10m",&local_49);
    std::operator+(&local_28,&local_48,"uuid");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;6m",&local_49);
    std::operator+(&local_28,&local_48,"number");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;14m",&local_49);
    std::operator+(&local_28,&local_48,"hex");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;3m",&local_49);
    std::operator+(&local_28,&local_48,"string");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;4m",&local_49);
    std::operator+(&local_28,&local_48,"url");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\x1b[37;102m",&local_49)
    ;
    std::operator+(&local_28,&local_48,"path");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\x1b[37;42m",&local_49);
    std::operator+(&local_28,&local_48,"pattern");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;7m\x1b[48;5;203m",&local_49);
    std::operator+(&local_28,&local_48,"op");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 8:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;15m\x1b[48;5;236m",&local_49);
    std::operator+(&local_28,&local_48,"word");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;15m\x1b[48;5;34m",&local_49);
    std::operator+(&local_28,&local_48,"date");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"\x1b[38;5;15m\x1b[48;5;34m",&local_49);
    std::operator+(&local_28,&local_48,"duration");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\x1b[37;41m",&local_49);
    std::operator+(&local_28,&local_48,"unknown");
    std::operator+(__return_storage_ptr__,&local_28,"\x1b[0m");
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::typeToString (Lexer::Type type)
{
       if (type == Lexer::Type::string)       return std::string ("\033[38;5;7m\033[48;5;3m")    + "string"       + "\033[0m";
  else if (type == Lexer::Type::uuid)         return std::string ("\033[38;5;7m\033[48;5;10m")   + "uuid"         + "\033[0m";
  else if (type == Lexer::Type::hex)          return std::string ("\033[38;5;7m\033[48;5;14m")   + "hex"          + "\033[0m";
  else if (type == Lexer::Type::number)       return std::string ("\033[38;5;7m\033[48;5;6m")    + "number"       + "\033[0m";
  else if (type == Lexer::Type::url)          return std::string ("\033[38;5;7m\033[48;5;4m")    + "url"          + "\033[0m";
  else if (type == Lexer::Type::path)         return std::string ("\033[37;102m")                + "path"         + "\033[0m";
  else if (type == Lexer::Type::pattern)      return std::string ("\033[37;42m")                 + "pattern"      + "\033[0m";
  else if (type == Lexer::Type::op)           return std::string ("\033[38;5;7m\033[48;5;203m")  + "op"           + "\033[0m";
  else if (type == Lexer::Type::word)         return std::string ("\033[38;5;15m\033[48;5;236m") + "word"         + "\033[0m";
  else if (type == Lexer::Type::date)         return std::string ("\033[38;5;15m\033[48;5;34m")  + "date"         + "\033[0m";
  else if (type == Lexer::Type::duration)     return std::string ("\033[38;5;15m\033[48;5;34m")  + "duration"     + "\033[0m";
  else                                        return std::string ("\033[37;41m")                 + "unknown"      + "\033[0m";
}